

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O1

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<5,_4,_3>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int i;
  long lVar1;
  Vector<float,_3> *in_RCX;
  Type in1;
  Vector<float,_3> res;
  Vector<float,_3> res_1;
  Type in0;
  Vector<float,_4> local_b0;
  Vec4 *local_a0;
  undefined8 local_98;
  float local_90 [8];
  float local_70 [3];
  float local_64 [3];
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  Matrix<float,_4,_3> local_40;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    local_58 = (evalCtx->coords).m_data[0];
    fStack_54 = (evalCtx->coords).m_data[1];
    fStack_50 = (evalCtx->coords).m_data[2];
    fStack_4c = (evalCtx->coords).m_data[3];
  }
  else {
    local_58 = (float)0x3fb33333;
    fStack_54 = (float)0x3e4ccccd;
    fStack_50 = (float)0xbf000000;
    fStack_4c = (float)0x3f333333;
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    local_b0.m_data._0_8_ = *(undefined8 *)(evalCtx->coords).m_data;
    local_b0.m_data[2] = (evalCtx->coords).m_data[2];
  }
  else {
    local_b0.m_data[0] = -0.2;
    local_b0.m_data[1] = 0.5;
    local_b0.m_data[2] = 0.8;
  }
  outerProduct<float,3,4>(&local_40,(MatrixCaseUtils *)&local_58,&local_b0,in_RCX);
  local_64[0] = local_40.m_data.m_data[0].m_data[0];
  local_64[1] = local_40.m_data.m_data[0].m_data[1];
  local_64[2] = local_40.m_data.m_data[0].m_data[2];
  local_70[0] = local_40.m_data.m_data[1].m_data[1];
  local_70[1] = local_40.m_data.m_data[1].m_data[2];
  local_70[2] = local_40.m_data.m_data[1].m_data[3];
  local_a0 = (Vec4 *)0x0;
  local_98 = (ulong)local_98._4_4_ << 0x20;
  lVar1 = 0;
  do {
    *(float *)((long)&local_a0 + lVar1 * 4) = local_90[lVar1 + 0xb] + local_90[lVar1 + 8];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  local_90[5] = local_40.m_data.m_data[2].m_data[2];
  local_90[6] = local_40.m_data.m_data[2].m_data[3];
  local_90[7] = local_40.m_data.m_data[2].m_data[0];
  local_90[2] = 0.0;
  local_90[3] = 0.0;
  local_90[4] = 0.0;
  lVar1 = 0;
  do {
    local_90[lVar1 + 2] = *(float *)((long)&local_a0 + lVar1 * 4) + local_90[lVar1 + 5];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  local_a0 = &evalCtx->color;
  local_98 = 0x100000000;
  local_90[0] = 2.8026e-45;
  lVar1 = 2;
  do {
    (evalCtx->color).m_data[*(int *)((long)&local_a0 + lVar1 * 4)] = local_90[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(outerProduct(in0, in1));
	}